

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O1

_Bool duckdb_je_ckh_insert(tsd_t *tsd,ckh_t *ckh,void *key,void *data)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  rtree_ctx_t *prVar3;
  undefined8 *puVar4;
  uint uVar5;
  void *pvVar6;
  ckhc_t *aTab;
  arena_t *paVar7;
  rtree_leaf_elm_t *prVar8;
  long lVar9;
  _Bool _Var10;
  _Bool _Var11;
  ulong uVar12;
  ckhc_t *pcVar13;
  rtree_leaf_elm_t *prVar14;
  atomic_p_t arena;
  byte bVar15;
  ulong uVar16;
  uint uVar17;
  rtree_ctx_t *prVar18;
  int iVar19;
  int iVar20;
  rtree_leaf_elm_t *prVar21;
  rtree_ctx_cache_elm_t *prVar22;
  rtree_ctx_cache_elm_t *prVar23;
  size_t usize;
  bool bVar24;
  rtree_ctx_t rtree_ctx_fallback;
  void *local_1c0;
  void *local_1b8;
  rtree_ctx_t local_1b0;
  
  local_1c0 = data;
  local_1b8 = key;
  _Var10 = ckh_try_insert(ckh,&local_1b8,&local_1c0);
  if (_Var10) {
    prVar3 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    do {
      uVar5 = ckh->lg_curbuckets;
      iVar20 = uVar5 + 2;
      do {
        bVar15 = (byte)(iVar20 + 1);
        uVar12 = 0x10L << (bVar15 & 0x3f);
        if (uVar12 < 0x3801) {
          uVar17 = (int)uVar12 + 0x3fU & 0x7fc0;
          if (uVar17 < 0x1001) {
            usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar17 >> 3]];
          }
          else {
            uVar16 = (ulong)uVar17 * 2 - 1;
            lVar9 = 0x3f;
            if (uVar16 != 0) {
              for (; uVar16 >> lVar9 == 0; lVar9 = lVar9 + -1) {
              }
            }
            uVar16 = -1L << (0x3c - ((byte)lVar9 ^ 0x3f) & 0x3f);
            usize = ~uVar16 + (ulong)uVar17 & uVar16;
          }
          if (0x3fff < usize) goto LAB_011aba45;
        }
        else {
LAB_011aba45:
          uVar16 = 0x4000;
          if (0x4000 < uVar12) {
            if (uVar12 < 0x7000000000000001) {
              uVar16 = (0x20L << (bVar15 & 0x3f)) - 1;
              lVar9 = 0x3f;
              if (uVar16 != 0) {
                for (; uVar16 >> lVar9 == 0; lVar9 = lVar9 + -1) {
                }
              }
              uVar16 = -1L << (0x3c - ((byte)lVar9 ^ 0x3f) & 0x3f);
              uVar16 = ~uVar16 + uVar12 & uVar16;
            }
            else {
              uVar16 = 0;
            }
            if (uVar16 < uVar12) {
              usize = 0;
              goto LAB_011abab4;
            }
          }
          usize = 0;
          if (!CARRY8(duckdb_je_sz_large_pad,uVar16)) {
            usize = uVar16;
          }
        }
LAB_011abab4:
        iVar19 = 4;
        if (0x8fffffffffffffff < usize + 0x8fffffffffffffff) {
          if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01')
          {
            arena.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
            if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0
                ) && (arena.repr = duckdb_je_arena_choose_hard(tsd,true),
                     tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled ==
                     true)) {
              paVar7 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).
                       arena;
              if (paVar7 == (arena_t *)0x0) {
                duckdb_je_tcache_arena_associate
                          ((tsdn_t *)tsd,
                           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                           (arena_t *)arena.repr);
              }
              else if (paVar7 != (arena_t *)arena.repr) {
                duckdb_je_tcache_arena_reassociate
                          ((tsdn_t *)tsd,
                           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                           (arena_t *)arena.repr);
              }
            }
          }
          else {
            arena.repr = duckdb_je_arenas[0].repr;
            if (duckdb_je_arenas[0].repr == (void *)0x0) {
              arena.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
            }
          }
          pcVar13 = (ckhc_t *)
                    duckdb_je_arena_palloc
                              ((tsdn_t *)tsd,(arena_t *)arena.repr,usize,0x40,true,usize < 0x3801,
                               (tcache_t *)0x0);
          if (pcVar13 != (ckhc_t *)0x0) {
            prVar18 = prVar3;
            if (tsd == (tsd_t *)0x0) {
              prVar18 = &local_1b0;
              duckdb_je_rtree_ctx_data_init(prVar18);
            }
            uVar17 = (uint)((ulong)pcVar13 >> 0x1e) & 0xf;
            prVar21 = (rtree_leaf_elm_t *)((ulong)pcVar13 & 0xffffffffc0000000);
            uVar12 = (ulong)(uVar17 << 4);
            puVar4 = (undefined8 *)((long)&prVar18->cache[0].leafkey + uVar12);
            prVar14 = *(rtree_leaf_elm_t **)((long)&prVar18->cache[0].leafkey + uVar12);
            if (prVar14 == prVar21) {
              prVar14 = (rtree_leaf_elm_t *)
                        ((ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8) + puVar4[1]);
            }
            else if ((rtree_leaf_elm_t *)prVar18->l2_cache[0].leafkey == prVar21) {
              prVar8 = prVar18->l2_cache[0].leaf;
              prVar18->l2_cache[0].leafkey = (uintptr_t)prVar14;
              prVar18->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
              *puVar4 = prVar21;
              puVar4[1] = prVar8;
              prVar14 = (rtree_leaf_elm_t *)
                        ((long)&(prVar8->le_bits).repr +
                        (ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8));
            }
            else {
              prVar22 = prVar18->l2_cache + 1;
              if ((rtree_leaf_elm_t *)prVar18->l2_cache[1].leafkey == prVar21) {
                uVar12 = 0;
                bVar24 = false;
              }
              else {
                uVar12 = 0;
                prVar23 = prVar22;
                do {
                  if (uVar12 == 6) {
                    bVar24 = true;
                    goto LAB_011ac0b9;
                  }
                  prVar22 = prVar23 + 1;
                  uVar12 = uVar12 + 1;
                  prVar2 = prVar23 + 1;
                  prVar23 = prVar22;
                } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar21);
                bVar24 = 6 < uVar12;
              }
              prVar8 = prVar22->leaf;
              prVar22->leafkey = prVar18->l2_cache[uVar12].leafkey;
              prVar22->leaf = prVar18->l2_cache[uVar12].leaf;
              prVar18->l2_cache[uVar12].leafkey = (uintptr_t)prVar14;
              prVar18->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar4[1];
              *puVar4 = prVar21;
              puVar4[1] = prVar8;
              prVar14 = (rtree_leaf_elm_t *)
                        ((long)&(prVar8->le_bits).repr +
                        (ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8));
LAB_011ac0b9:
              if (bVar24) {
                prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                                    ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar18,
                                     (uintptr_t)pcVar13,true,false);
              }
            }
            pvVar6 = duckdb_je_arenas
                     [*(uint *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80
                               ) & 0xfff].repr;
            prVar18 = prVar3;
            if (tsd == (tsd_t *)0x0) {
              duckdb_je_rtree_ctx_data_init(&local_1b0);
              prVar18 = &local_1b0;
            }
            uVar12 = (ulong)(uVar17 << 4);
            puVar4 = (undefined8 *)((long)&prVar18->cache[0].leafkey + uVar12);
            prVar14 = *(rtree_leaf_elm_t **)((long)&prVar18->cache[0].leafkey + uVar12);
            if (prVar14 == prVar21) {
              prVar14 = (rtree_leaf_elm_t *)
                        ((ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8) + puVar4[1]);
            }
            else if ((rtree_leaf_elm_t *)prVar18->l2_cache[0].leafkey == prVar21) {
              prVar8 = prVar18->l2_cache[0].leaf;
              prVar18->l2_cache[0].leafkey = (uintptr_t)prVar14;
              prVar18->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
              *puVar4 = prVar21;
              puVar4[1] = prVar8;
              prVar14 = (rtree_leaf_elm_t *)
                        ((long)&(prVar8->le_bits).repr +
                        (ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8));
            }
            else {
              prVar22 = prVar18->l2_cache + 1;
              if ((rtree_leaf_elm_t *)prVar18->l2_cache[1].leafkey == prVar21) {
                uVar12 = 0;
                bVar24 = false;
              }
              else {
                uVar12 = 0;
                prVar23 = prVar22;
                do {
                  if (uVar12 == 6) {
                    bVar24 = true;
                    goto LAB_011ac13f;
                  }
                  prVar22 = prVar23 + 1;
                  uVar12 = uVar12 + 1;
                  prVar2 = prVar23 + 1;
                  prVar23 = prVar22;
                } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar21);
                bVar24 = 6 < uVar12;
              }
              prVar8 = prVar22->leaf;
              prVar22->leafkey = prVar18->l2_cache[uVar12].leafkey;
              prVar22->leaf = prVar18->l2_cache[uVar12].leaf;
              prVar18->l2_cache[uVar12].leafkey = (uintptr_t)prVar14;
              prVar18->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar4[1];
              *puVar4 = prVar21;
              puVar4[1] = prVar8;
              prVar14 = (rtree_leaf_elm_t *)
                        ((long)&(prVar8->le_bits).repr +
                        (ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8));
LAB_011ac13f:
              if (bVar24) {
                prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                                    ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar18,
                                     (uintptr_t)pcVar13,true,false);
              }
            }
            LOCK();
            plVar1 = (long *)((long)pvVar6 + 0x48);
            *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar14->le_bits).repr >> 0x30];
            UNLOCK();
            aTab = ckh->tab;
            ckh->tab = pcVar13;
            ckh->lg_curbuckets = iVar20 - 1;
            _Var11 = ckh_rebuild(ckh,aTab);
            if (_Var11) {
              pcVar13 = ckh->tab;
              prVar18 = prVar3;
              if (tsd == (tsd_t *)0x0) {
                prVar18 = &local_1b0;
                duckdb_je_rtree_ctx_data_init(prVar18);
              }
              uVar17 = (uint)((ulong)pcVar13 >> 0x1e) & 0xf;
              prVar21 = (rtree_leaf_elm_t *)((ulong)pcVar13 & 0xffffffffc0000000);
              uVar12 = (ulong)(uVar17 << 4);
              puVar4 = (undefined8 *)((long)&prVar18->cache[0].leafkey + uVar12);
              prVar14 = *(rtree_leaf_elm_t **)((long)&prVar18->cache[0].leafkey + uVar12);
              if (prVar14 == prVar21) {
                prVar14 = (rtree_leaf_elm_t *)
                          ((ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8) + puVar4[1]);
              }
              else if ((rtree_leaf_elm_t *)prVar18->l2_cache[0].leafkey == prVar21) {
                prVar8 = prVar18->l2_cache[0].leaf;
                prVar18->l2_cache[0].leafkey = (uintptr_t)prVar14;
                prVar18->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
                *puVar4 = prVar21;
                puVar4[1] = prVar8;
                prVar14 = (rtree_leaf_elm_t *)
                          ((long)&(prVar8->le_bits).repr +
                          (ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8));
              }
              else {
                prVar22 = prVar18->l2_cache + 1;
                if ((rtree_leaf_elm_t *)prVar18->l2_cache[1].leafkey == prVar21) {
                  uVar12 = 0;
                  bVar24 = false;
                }
                else {
                  uVar12 = 0;
                  prVar23 = prVar22;
                  do {
                    if (uVar12 == 6) {
                      bVar24 = true;
                      goto LAB_011ac1c2;
                    }
                    prVar22 = prVar23 + 1;
                    uVar12 = uVar12 + 1;
                    prVar2 = prVar23 + 1;
                    prVar23 = prVar22;
                  } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar21);
                  bVar24 = 6 < uVar12;
                }
                prVar8 = prVar22->leaf;
                prVar22->leafkey = prVar18->l2_cache[uVar12].leafkey;
                prVar22->leaf = prVar18->l2_cache[uVar12].leaf;
                prVar18->l2_cache[uVar12].leafkey = (uintptr_t)prVar14;
                prVar18->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar4[1];
                *puVar4 = prVar21;
                puVar4[1] = prVar8;
                prVar14 = (rtree_leaf_elm_t *)
                          ((long)&(prVar8->le_bits).repr +
                          (ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8));
LAB_011ac1c2:
                if (bVar24) {
                  prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                                      ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar18,
                                       (uintptr_t)pcVar13,true,false);
                }
              }
              pvVar6 = duckdb_je_arenas
                       [*(uint *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 &
                                 0xffffffffffffff80) & 0xfff].repr;
              prVar18 = prVar3;
              if (tsd == (tsd_t *)0x0) {
                duckdb_je_rtree_ctx_data_init(&local_1b0);
                prVar18 = &local_1b0;
              }
              uVar12 = (ulong)(uVar17 << 4);
              puVar4 = (undefined8 *)((long)&prVar18->cache[0].leafkey + uVar12);
              prVar14 = *(rtree_leaf_elm_t **)((long)&prVar18->cache[0].leafkey + uVar12);
              if (prVar14 == prVar21) {
                prVar14 = (rtree_leaf_elm_t *)
                          ((ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8) + puVar4[1]);
              }
              else if ((rtree_leaf_elm_t *)prVar18->l2_cache[0].leafkey == prVar21) {
                prVar8 = prVar18->l2_cache[0].leaf;
                prVar18->l2_cache[0].leafkey = (uintptr_t)prVar14;
                prVar18->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
                *puVar4 = prVar21;
                puVar4[1] = prVar8;
                prVar14 = (rtree_leaf_elm_t *)
                          ((long)&(prVar8->le_bits).repr +
                          (ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8));
              }
              else {
                prVar22 = prVar18->l2_cache + 1;
                if ((rtree_leaf_elm_t *)prVar18->l2_cache[1].leafkey == prVar21) {
                  uVar12 = 0;
                  bVar24 = false;
                }
                else {
                  uVar12 = 0;
                  prVar23 = prVar22;
                  do {
                    if (uVar12 == 6) {
                      bVar24 = true;
                      goto LAB_011ac248;
                    }
                    prVar22 = prVar23 + 1;
                    uVar12 = uVar12 + 1;
                    prVar2 = prVar23 + 1;
                    prVar23 = prVar22;
                  } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar21);
                  bVar24 = 6 < uVar12;
                }
                prVar8 = prVar22->leaf;
                prVar22->leafkey = prVar18->l2_cache[uVar12].leafkey;
                prVar22->leaf = prVar18->l2_cache[uVar12].leaf;
                prVar18->l2_cache[uVar12].leafkey = (uintptr_t)prVar14;
                prVar18->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar4[1];
                *puVar4 = prVar21;
                puVar4[1] = prVar8;
                prVar14 = (rtree_leaf_elm_t *)
                          ((long)&(prVar8->le_bits).repr +
                          (ulong)((uint)((ulong)pcVar13 >> 9) & 0x1ffff8));
LAB_011ac248:
                if (bVar24) {
                  prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                                      ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar18,
                                       (uintptr_t)pcVar13,true,false);
                }
              }
              LOCK();
              plVar1 = (long *)((long)pvVar6 + 0x48);
              *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab
                                  [(ulong)(prVar14->le_bits).repr >> 0x30];
              UNLOCK();
              arena_dalloc_no_tcache((tsdn_t *)tsd,pcVar13);
              ckh->tab = aTab;
              ckh->lg_curbuckets = uVar5;
              iVar19 = 0;
            }
            else {
              prVar18 = prVar3;
              if (tsd == (tsd_t *)0x0) {
                prVar18 = &local_1b0;
                duckdb_je_rtree_ctx_data_init(prVar18);
              }
              uVar17 = (uint)((ulong)aTab >> 0x1e) & 0xf;
              prVar21 = (rtree_leaf_elm_t *)((ulong)aTab & 0xffffffffc0000000);
              uVar12 = (ulong)(uVar17 << 4);
              puVar4 = (undefined8 *)((long)&prVar18->cache[0].leafkey + uVar12);
              prVar14 = *(rtree_leaf_elm_t **)((long)&prVar18->cache[0].leafkey + uVar12);
              if (prVar14 == prVar21) {
                prVar14 = (rtree_leaf_elm_t *)
                          ((ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8) + puVar4[1]);
              }
              else if ((rtree_leaf_elm_t *)prVar18->l2_cache[0].leafkey == prVar21) {
                prVar8 = prVar18->l2_cache[0].leaf;
                prVar18->l2_cache[0].leafkey = (uintptr_t)prVar14;
                prVar18->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
                *puVar4 = prVar21;
                puVar4[1] = prVar8;
                prVar14 = (rtree_leaf_elm_t *)
                          ((long)&(prVar8->le_bits).repr +
                          (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
              }
              else {
                prVar22 = prVar18->l2_cache + 1;
                if ((rtree_leaf_elm_t *)prVar18->l2_cache[1].leafkey == prVar21) {
                  uVar12 = 0;
                  bVar24 = false;
                }
                else {
                  uVar12 = 0;
                  prVar23 = prVar22;
                  do {
                    if (uVar12 == 6) {
                      bVar24 = true;
                      goto LAB_011ac2ca;
                    }
                    prVar22 = prVar23 + 1;
                    uVar12 = uVar12 + 1;
                    prVar2 = prVar23 + 1;
                    prVar23 = prVar22;
                  } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar21);
                  bVar24 = 6 < uVar12;
                }
                prVar8 = prVar22->leaf;
                prVar22->leafkey = prVar18->l2_cache[uVar12].leafkey;
                prVar22->leaf = prVar18->l2_cache[uVar12].leaf;
                prVar18->l2_cache[uVar12].leafkey = (uintptr_t)prVar14;
                prVar18->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar4[1];
                *puVar4 = prVar21;
                puVar4[1] = prVar8;
                prVar14 = (rtree_leaf_elm_t *)
                          ((long)&(prVar8->le_bits).repr +
                          (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
LAB_011ac2ca:
                if (bVar24) {
                  prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                                      ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar18,
                                       (uintptr_t)aTab,true,false);
                }
              }
              pvVar6 = duckdb_je_arenas
                       [*(uint *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 &
                                 0xffffffffffffff80) & 0xfff].repr;
              prVar18 = prVar3;
              if (tsd == (tsd_t *)0x0) {
                prVar18 = &local_1b0;
                duckdb_je_rtree_ctx_data_init(prVar18);
              }
              uVar12 = (ulong)(uVar17 << 4);
              puVar4 = (undefined8 *)((long)&prVar18->cache[0].leafkey + uVar12);
              prVar14 = *(rtree_leaf_elm_t **)((long)&prVar18->cache[0].leafkey + uVar12);
              if (prVar14 == prVar21) {
                prVar14 = (rtree_leaf_elm_t *)
                          ((ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8) + puVar4[1]);
              }
              else if ((rtree_leaf_elm_t *)prVar18->l2_cache[0].leafkey == prVar21) {
                prVar8 = prVar18->l2_cache[0].leaf;
                prVar18->l2_cache[0].leafkey = (uintptr_t)prVar14;
                prVar18->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
                *puVar4 = prVar21;
                puVar4[1] = prVar8;
                prVar14 = (rtree_leaf_elm_t *)
                          ((long)&(prVar8->le_bits).repr +
                          (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
              }
              else {
                prVar22 = prVar18->l2_cache + 1;
                if ((rtree_leaf_elm_t *)prVar18->l2_cache[1].leafkey == prVar21) {
                  uVar12 = 0;
                  bVar24 = false;
                }
                else {
                  uVar12 = 0;
                  prVar23 = prVar22;
                  do {
                    if (uVar12 == 6) {
                      bVar24 = true;
                      goto LAB_011ac34f;
                    }
                    prVar22 = prVar23 + 1;
                    uVar12 = uVar12 + 1;
                    prVar2 = prVar23 + 1;
                    prVar23 = prVar22;
                  } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar21);
                  bVar24 = 6 < uVar12;
                }
                prVar8 = prVar22->leaf;
                prVar22->leafkey = prVar18->l2_cache[uVar12].leafkey;
                prVar22->leaf = prVar18->l2_cache[uVar12].leaf;
                prVar18->l2_cache[uVar12].leafkey = (uintptr_t)prVar14;
                prVar18->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar4[1];
                *puVar4 = prVar21;
                puVar4[1] = prVar8;
                prVar14 = (rtree_leaf_elm_t *)
                          ((long)&(prVar8->le_bits).repr +
                          (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
LAB_011ac34f:
                if (bVar24) {
                  prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                                      ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar18,
                                       (uintptr_t)aTab,true,false);
                }
              }
              LOCK();
              plVar1 = (long *)((long)pvVar6 + 0x48);
              *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab
                                  [(ulong)(prVar14->le_bits).repr >> 0x30];
              UNLOCK();
              arena_dalloc_no_tcache((tsdn_t *)tsd,aTab);
              iVar19 = 3;
            }
          }
        }
        iVar20 = iVar20 + 1;
      } while (iVar19 == 0);
    } while ((iVar19 == 3) && (_Var10 = ckh_try_insert(ckh,&local_1b8,&local_1c0), _Var10));
  }
  return _Var10;
}

Assistant:

bool
ckh_insert(tsd_t *tsd, ckh_t *ckh, const void *key, const void *data) {
	bool ret;

	assert(ckh != NULL);
	assert(ckh_search(ckh, key, NULL, NULL));

#ifdef CKH_COUNT
	ckh->ninserts++;
#endif

	while (ckh_try_insert(ckh, &key, &data)) {
		if (ckh_grow(tsd, ckh)) {
			ret = true;
			goto label_return;
		}
	}

	ret = false;
label_return:
	return ret;
}